

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

void Curl_client_cleanup(Curl_easy *data)

{
  Curl_cwriter *pCVar1;
  dynbuf *s;
  ulong uVar2;
  
  pCVar1 = (data->req).writer_stack;
  while (pCVar1 != (Curl_cwriter *)0x0) {
    (data->req).writer_stack = pCVar1->next;
    (*pCVar1->cwt->do_close)(data,pCVar1);
    (*Curl_cfree)(pCVar1);
    pCVar1 = (data->req).writer_stack;
  }
  if ((data->state).tempcount != 0) {
    s = &(data->state).tempwrite[0].b;
    uVar2 = 0;
    do {
      Curl_dyn_free(s);
      uVar2 = uVar2 + 1;
      s = (dynbuf *)&s[1].leng;
    } while (uVar2 < (data->state).tempcount);
  }
  (data->state).tempcount = 0;
  (data->req).bytecount = 0;
  (data->req).headerline = 0;
  return;
}

Assistant:

void Curl_client_cleanup(struct Curl_easy *data)
{
  struct Curl_cwriter *writer = data->req.writer_stack;
  size_t i;

  while(writer) {
    data->req.writer_stack = writer->next;
    writer->cwt->do_close(data, writer);
    free(writer);
    writer = data->req.writer_stack;
  }

  for(i = 0; i < data->state.tempcount; i++) {
    Curl_dyn_free(&data->state.tempwrite[i].b);
  }
  data->state.tempcount = 0;
  data->req.bytecount = 0;
  data->req.headerline = 0;
}